

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void option_side_effects(Telnet *telnet,Opt *o,_Bool enabled)

{
  size_t sVar1;
  undefined2 local_11;
  undefined1 local_f;
  undefined2 local_e;
  undefined1 local_c;
  undefined2 local_b;
  undefined1 local_9;
  
  if (o->option == 3) {
    if (o->send == 0xfd) {
      telnet->editing = !enabled;
    }
  }
  else if ((o->option == 1) && (o->send == 0xfd)) {
    telnet->echoing = !enabled;
  }
  if (telnet->ldisc != (Ldisc *)0x0) {
    ldisc_echoedit_update(telnet->ldisc);
  }
  if (telnet->activated == false) {
    if (telnet->opt_states[5] == 2) {
      telnet->opt_states[5] = 0;
      local_11 = 0xfdff;
      local_f = 1;
      sVar1 = (*telnet->s->vt->write)(telnet->s,&local_11,3);
      telnet->bufsize = sVar1;
      logeventf(telnet->logctx,"%s negotiation: %s %s","client","DO","ECHO");
    }
    if (telnet->opt_states[6] == 2) {
      telnet->opt_states[6] = 0;
      local_e = 0xfbff;
      local_c = 3;
      sVar1 = (*telnet->s->vt->write)(telnet->s,&local_e,3);
      telnet->bufsize = sVar1;
      logeventf(telnet->logctx,"%s negotiation: %s %s","client","WILL","SGA");
    }
    if (telnet->opt_states[7] == 2) {
      telnet->opt_states[7] = 0;
      local_b = 0xfdff;
      local_9 = 3;
      sVar1 = (*telnet->s->vt->write)(telnet->s,&local_b,3);
      telnet->bufsize = sVar1;
      logeventf(telnet->logctx,"%s negotiation: %s %s","client","DO","SGA");
    }
    telnet->activated = true;
  }
  return;
}

Assistant:

static void option_side_effects(
    Telnet *telnet, const struct Opt *o, bool enabled)
{
    if (o->option == TELOPT_ECHO && o->send == DO)
        telnet->echoing = !enabled;
    else if (o->option == TELOPT_SGA && o->send == DO)
        telnet->editing = !enabled;
    if (telnet->ldisc)                 /* cause ldisc to notice the change */
        ldisc_echoedit_update(telnet->ldisc);

    /* Ensure we get the minimum options */
    if (!telnet->activated) {
        if (telnet->opt_states[o_echo.index] == INACTIVE) {
            telnet->opt_states[o_echo.index] = REQUESTED;
            send_opt(telnet, o_echo.send, o_echo.option);
        }
        if (telnet->opt_states[o_we_sga.index] == INACTIVE) {
            telnet->opt_states[o_we_sga.index] = REQUESTED;
            send_opt(telnet, o_we_sga.send, o_we_sga.option);
        }
        if (telnet->opt_states[o_they_sga.index] == INACTIVE) {
            telnet->opt_states[o_they_sga.index] = REQUESTED;
            send_opt(telnet, o_they_sga.send, o_they_sga.option);
        }
        telnet->activated = true;
    }
}